

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glx_context.c
# Opt level: O0

GLXContext createLegacyContext(_GLFWwindow *window,GLXFBConfig fbconfig,GLXContext share)

{
  GLXContext share_local;
  GLXFBConfig fbconfig_local;
  _GLFWwindow *window_local;
  
  if (_glfw.glx.SGIX_fbconfig == '\0') {
    window_local = (_GLFWwindow *)glXCreateNewContext(_glfw.x11.display,fbconfig,0x8014,share,1);
  }
  else {
    window_local = (_GLFWwindow *)
                   (*_glfw.glx.CreateContextWithConfigSGIX)
                             (_glfw.x11.display,fbconfig,0x8014,share,1);
  }
  return (GLXContext)window_local;
}

Assistant:

static GLXContext createLegacyContext(_GLFWwindow* window,
                                      GLXFBConfig fbconfig,
                                      GLXContext share)
{
    if (_glfw.glx.SGIX_fbconfig)
    {
        return _glfw.glx.CreateContextWithConfigSGIX(_glfw.x11.display,
                                                     fbconfig,
                                                     GLX_RGBA_TYPE,
                                                     share,
                                                     True);
    }

    return glXCreateNewContext(_glfw.x11.display,
                               fbconfig,
                               GLX_RGBA_TYPE,
                               share,
                               True);
}